

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

endpoint_type * __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
          (endpoint_type *__return_storage_ptr__,reactive_socket_service<asio::ip::tcp> *this,
          implementation_type *impl,error_code *ec)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  socklen_t sVar4;
  uint tmp_addrlen;
  endpoint_type endpoint;
  socklen_t local_4c;
  data_union local_48;
  
  local_48._8_4_ = 0;
  local_48._12_4_ = 0;
  local_48._16_4_ = 0;
  local_48._20_8_ = 0;
  local_48._0_8_ = 2;
  iVar2 = (impl->super_base_implementation_type).socket_;
  if (iVar2 == -1) {
    std::error_code::operator=((error_code *)ec,bad_descriptor);
    sVar4 = 0x1c;
  }
  else {
    local_4c = 0x1c;
    iVar2 = getpeername(iVar2,(sockaddr *)&local_48.base,&local_4c);
    sVar4 = local_4c;
    if (iVar2 == 0) {
      ec->_M_value = 0;
      bVar1 = true;
      goto LAB_0011382c;
    }
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    if (system_category()::instance == '\0') {
      remote_endpoint();
    }
    ec->_M_value = iVar2;
    ec->_M_cat = (error_category *)&system_category()::instance;
  }
  bVar1 = false;
LAB_0011382c:
  if (bVar1) {
    ip::basic_endpoint<asio::ip::tcp>::resize
              ((basic_endpoint<asio::ip::tcp> *)&local_48.base,(ulong)sVar4);
    *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 0xc) =
         CONCAT44(local_48._16_4_,local_48._12_4_);
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x14) = local_48._20_8_;
    *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = local_48._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 8) =
         CONCAT44(local_48._12_4_,local_48._8_4_);
  }
  else {
    *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0xc) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x14) = 0;
    *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 2;
  }
  return __return_storage_ptr__;
}

Assistant:

endpoint_type remote_endpoint(const implementation_type& impl,
      asio::error_code& ec) const
  {
    endpoint_type endpoint;
    std::size_t addr_len = endpoint.capacity();
    if (socket_ops::getpeername(impl.socket_,
          endpoint.data(), &addr_len, false, ec))
      return endpoint_type();
    endpoint.resize(addr_len);
    return endpoint;
  }